

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-impl.cpp
# Opt level: O1

string * gguf_data_to_str_abi_cxx11_(string *__return_storage_ptr__,gguf_type type,void *data,int i)

{
  byte bVar1;
  ushort uVar2;
  bool bVar3;
  uint uVar4;
  char cVar5;
  char cVar6;
  uint uVar7;
  ulong uVar8;
  size_t __n;
  ulong uVar9;
  string *__str;
  char *pcVar10;
  uint uVar11;
  uint __len;
  uint uVar12;
  ulong __val;
  pointer pcVar13;
  double dVar14;
  
  switch((ulong)type) {
  case 0:
    bVar1 = *(byte *)((long)data + (long)i);
    uVar11 = (uint)bVar1;
    __len = 1;
    if (9 < bVar1) {
      __len = 3 - (bVar1 < 100);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)__len);
    pcVar13 = (__return_storage_ptr__->_M_dataplus)._M_p;
    break;
  case 1:
    uVar12 = (uint)*(char *)((long)data + (long)i);
    uVar11 = -uVar12;
    if (0 < (int)uVar12) {
      uVar11 = uVar12;
    }
    __len = 1;
    if (9 < uVar11) {
      __len = 3 - (uVar11 < 100);
    }
    goto LAB_001aecb5;
  case 2:
    uVar2 = *(ushort *)((long)data + (long)i * 2);
    uVar11 = (uint)uVar2;
    __len = 1;
    if (((9 < uVar11) && (__len = 2, 99 < uVar2)) && (__len = 3, 999 < uVar11)) {
      __len = 5 - (uVar11 < 10000);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)__len);
    pcVar13 = (__return_storage_ptr__->_M_dataplus)._M_p;
    break;
  case 3:
    uVar12 = (uint)*(short *)((long)data + (long)i * 2);
    uVar11 = -uVar12;
    if (0 < (int)uVar12) {
      uVar11 = uVar12;
    }
    __len = 1;
    if (((9 < uVar11) && (__len = 2, 99 < uVar11)) && (__len = 3, 999 < uVar11)) {
      __len = 5 - (uVar11 < 10000);
    }
LAB_001aecb5:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct
              ((ulong)__return_storage_ptr__,(char)__len - (char)((int)uVar12 >> 0x1f));
    pcVar13 = (__return_storage_ptr__->_M_dataplus)._M_p + (uVar12 >> 0x1f);
    break;
  case 4:
    uVar11 = *(uint *)((long)data + (long)i * 4);
    cVar6 = '\x01';
    if (9 < uVar11) {
      uVar12 = uVar11;
      cVar5 = '\x04';
      do {
        cVar6 = cVar5;
        if (uVar12 < 100) {
          cVar6 = cVar6 + -2;
          goto LAB_001aee54;
        }
        if (uVar12 < 1000) {
          cVar6 = cVar6 + -1;
          goto LAB_001aee54;
        }
        if (uVar12 < 10000) goto LAB_001aee54;
        bVar3 = 99999 < uVar12;
        uVar12 = uVar12 / 10000;
        cVar5 = cVar6 + '\x04';
      } while (bVar3);
      cVar6 = cVar6 + '\x01';
    }
LAB_001aee54:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,cVar6);
    pcVar13 = (__return_storage_ptr__->_M_dataplus)._M_p;
    __len = (uint)__return_storage_ptr__->_M_string_length;
    break;
  case 5:
    uVar12 = *(uint *)((long)data + (long)i * 4);
    uVar11 = -uVar12;
    if (0 < (int)uVar12) {
      uVar11 = uVar12;
    }
    __len = 1;
    if (9 < uVar11) {
      uVar9 = (ulong)uVar11;
      uVar4 = 4;
      do {
        __len = uVar4;
        uVar7 = (uint)uVar9;
        if (uVar7 < 100) {
          __len = __len - 2;
          goto LAB_001aee72;
        }
        if (uVar7 < 1000) {
          __len = __len - 1;
          goto LAB_001aee72;
        }
        if (uVar7 < 10000) goto LAB_001aee72;
        uVar9 = uVar9 / 10000;
        uVar4 = __len + 4;
      } while (99999 < uVar7);
      __len = __len + 1;
    }
LAB_001aee72:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct
              ((ulong)__return_storage_ptr__,(char)__len - (char)((int)uVar12 >> 0x1f));
    pcVar13 = (__return_storage_ptr__->_M_dataplus)._M_p + (uVar12 >> 0x1f);
    break;
  case 6:
    dVar14 = (double)*(float *)((long)data + (long)i * 4);
    __n = 0x3a;
    goto LAB_001aecfa;
  case 7:
    bVar1 = *(byte *)((long)data + (long)i);
    pcVar10 = "false";
    if ((ulong)bVar1 != 0) {
      pcVar10 = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar10,pcVar10 + ((ulong)bVar1 ^ 5));
    return __return_storage_ptr__;
  default:
    format_abi_cxx11_(__return_storage_ptr__,"unknown type %d",(ulong)type);
    return __return_storage_ptr__;
  case 10:
    __val = *(ulong *)((long)data + (long)i * 8);
    cVar6 = '\x01';
    if (9 < __val) {
      uVar9 = __val;
      cVar5 = '\x04';
      do {
        cVar6 = cVar5;
        if (uVar9 < 100) {
          cVar6 = cVar6 + -2;
          goto LAB_001aeece;
        }
        if (uVar9 < 1000) {
          cVar6 = cVar6 + -1;
          goto LAB_001aeece;
        }
        if (uVar9 < 10000) goto LAB_001aeece;
        bVar3 = 99999 < uVar9;
        uVar9 = uVar9 / 10000;
        cVar5 = cVar6 + '\x04';
      } while (bVar3);
      cVar6 = cVar6 + '\x01';
    }
LAB_001aeece:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,cVar6);
    pcVar13 = (__return_storage_ptr__->_M_dataplus)._M_p;
    uVar11 = (uint)__return_storage_ptr__->_M_string_length;
    goto LAB_001aeee7;
  case 0xb:
    uVar9 = *(ulong *)((long)data + (long)i * 8);
    __val = -uVar9;
    if (0 < (long)uVar9) {
      __val = uVar9;
    }
    uVar11 = 1;
    if (9 < __val) {
      uVar8 = __val;
      uVar12 = 4;
      do {
        uVar11 = uVar12;
        if (uVar8 < 100) {
          uVar11 = uVar11 - 2;
          goto LAB_001aeea5;
        }
        if (uVar8 < 1000) {
          uVar11 = uVar11 - 1;
          goto LAB_001aeea5;
        }
        if (uVar8 < 10000) goto LAB_001aeea5;
        bVar3 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        uVar12 = uVar11 + 4;
      } while (bVar3);
      uVar11 = uVar11 + 1;
    }
LAB_001aeea5:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct
              ((ulong)__return_storage_ptr__,(char)uVar11 - (char)((long)uVar9 >> 0x3f));
    pcVar13 = (__return_storage_ptr__->_M_dataplus)._M_p + -((long)uVar9 >> 0x3f);
LAB_001aeee7:
    std::__detail::__to_chars_10_impl<unsigned_long>(pcVar13,uVar11,__val);
    return __return_storage_ptr__;
  case 0xc:
    dVar14 = *(double *)((long)data + (long)i * 8);
    __n = 0x148;
LAB_001aecfa:
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (__return_storage_ptr__,vsnprintf,__n,"%f",dVar14);
    return __return_storage_ptr__;
  }
  std::__detail::__to_chars_10_impl<unsigned_int>(pcVar13,__len,uVar11);
  return __return_storage_ptr__;
}

Assistant:

static std::string gguf_data_to_str(enum gguf_type type, const void * data, int i) {
    switch (type) {
        case GGUF_TYPE_UINT8:   return std::to_string(((const uint8_t  *)data)[i]);
        case GGUF_TYPE_INT8:    return std::to_string(((const int8_t   *)data)[i]);
        case GGUF_TYPE_UINT16:  return std::to_string(((const uint16_t *)data)[i]);
        case GGUF_TYPE_INT16:   return std::to_string(((const int16_t  *)data)[i]);
        case GGUF_TYPE_UINT32:  return std::to_string(((const uint32_t *)data)[i]);
        case GGUF_TYPE_INT32:   return std::to_string(((const int32_t  *)data)[i]);
        case GGUF_TYPE_UINT64:  return std::to_string(((const uint64_t *)data)[i]);
        case GGUF_TYPE_INT64:   return std::to_string(((const int64_t  *)data)[i]);
        case GGUF_TYPE_FLOAT32: return std::to_string(((const float    *)data)[i]);
        case GGUF_TYPE_FLOAT64: return std::to_string(((const double   *)data)[i]);
        case GGUF_TYPE_BOOL:    return ((const bool *)data)[i] ? "true" : "false";
        default:                return format("unknown type %d", type);
    }
}